

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void DB_(PDISASM pMyDisasm)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char (*local_20) [8];
  char (*pRegistersFPU) [8] [8];
  long MyMODRM;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar2 = Security(2,pMyDisasm);
  if (iVar2 != 0) {
    bVar1 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1);
    uVar3 = (ulong)bVar1;
    local_20 = RegistersFPU_Masm;
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x200) {
      local_20 = RegistersFPU_Nasm;
    }
    if (uVar3 < 0xc0) {
      (pMyDisasm->Reserved_).REGOPCODE = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
      switch((pMyDisasm->Reserved_).REGOPCODE) {
      case 0:
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fild");
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = 1;
        (pMyDisasm->Operand1).OpSize = 0x50;
        break;
      case 1:
        (pMyDisasm->Reserved_).MemDecoration = 3;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fisttp");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      case 2:
        (pMyDisasm->Reserved_).MemDecoration = 3;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fist");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      case 3:
        (pMyDisasm->Reserved_).MemDecoration = 3;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fistp");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
        break;
      default:
        failDecode(pMyDisasm);
        break;
      case 5:
        (pMyDisasm->Reserved_).MemDecoration = 0x6a;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fld");
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = 1;
        (pMyDisasm->Operand1).OpSize = 0x50;
        break;
      case 7:
        (pMyDisasm->Reserved_).MemDecoration = 6;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Instruction).Category = 0x20001;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fstp");
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = 1;
        (pMyDisasm->Operand2).OpSize = 0x50;
      }
    }
    else if ((uVar3 & 0xf0) == 0xc0) {
      if ((uVar3 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x20002;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fcmovnb");
      }
      else {
        (pMyDisasm->Instruction).Category = 0x20002;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fcmovne");
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      strcpy((pMyDisasm->Operand1).OpMnemonic,*local_20);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x1000;
      (pMyDisasm->Operand1).Registers.fpu = REGS[0];
      (pMyDisasm->Operand1).OpSize = 0x50;
      strcpy((pMyDisasm->Operand2).OpMnemonic,local_20[(uVar3 & 0xf) % 8]);
      (pMyDisasm->Operand2).OpType = 0x20000;
      (pMyDisasm->Operand2).Registers.type = 0x1000;
      (pMyDisasm->Operand2).Registers.fpu = REGS[(uVar3 & 0xf) % 8];
      (pMyDisasm->Operand2).OpSize = 0x50;
    }
    else if ((uVar3 & 0xf0) == 0xd0) {
      if ((uVar3 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x20002;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fcmovnbe");
      }
      else {
        (pMyDisasm->Instruction).Category = 0x20002;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fcmovnu");
        (pMyDisasm->Operand2).AccessMode = 2;
      }
      strcpy((pMyDisasm->Operand1).OpMnemonic,*local_20);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 0x1000;
      (pMyDisasm->Operand1).Registers.fpu = REGS[0];
      (pMyDisasm->Operand1).OpSize = 0x50;
      strcpy((pMyDisasm->Operand2).OpMnemonic,local_20[(uVar3 & 0xf) % 8]);
      (pMyDisasm->Operand2).OpType = 0x20000;
      (pMyDisasm->Operand2).Registers.type = 0x1000;
      (pMyDisasm->Operand2).Registers.fpu = REGS[(uVar3 & 0xf) % 8];
      (pMyDisasm->Operand2).OpSize = 0x50;
    }
    else if ((uVar3 & 0xf0) == 0xe0) {
      if ((bVar1 & 0xf) == 0) {
        (pMyDisasm->Instruction).Category = 0x20010;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fneni");
      }
      else if ((uVar3 & 0xf) == 1) {
        (pMyDisasm->Instruction).Category = 0x20010;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fndisi");
      }
      else if ((uVar3 & 0xf) == 2) {
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fnclex");
      }
      else if ((uVar3 & 0xf) == 3) {
        (pMyDisasm->Instruction).Category = 0x20012;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fninit");
      }
      else if ((uVar3 & 0xf) == 4) {
        (pMyDisasm->Instruction).Category = 0x20010;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fnsetpm");
      }
      else if ((uVar3 & 0xf) == 5) {
        (pMyDisasm->Instruction).Category = 0x20002;
        strcpy((pMyDisasm->Instruction).Mnemonic,"frstpm");
      }
      else if (((uVar3 & 0xf) < 8) || (0xf < (uVar3 & 0xf))) {
        failDecode(pMyDisasm);
      }
      else {
        (pMyDisasm->Instruction).Category = 0x2000d;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fucomi");
        strcpy((pMyDisasm->Operand1).OpMnemonic,*local_20);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
        (pMyDisasm->Operand1).AccessMode = 1;
        strcpy((pMyDisasm->Operand2).OpMnemonic,local_20[(uVar3 & 0xf) % 8]);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = REGS[(uVar3 & 0xf) % 8];
        (pMyDisasm->Operand2).OpSize = 0x50;
      }
    }
    else if ((uVar3 & 0xf0) == 0xf0) {
      if ((uVar3 & 0xf) < 8) {
        (pMyDisasm->Instruction).Category = 0x2000d;
        strcpy((pMyDisasm->Instruction).Mnemonic,"fcomi");
        strcpy((pMyDisasm->Operand1).OpMnemonic,*local_20);
        (pMyDisasm->Operand1).OpType = 0x20000;
        (pMyDisasm->Operand1).Registers.type = 0x1000;
        (pMyDisasm->Operand1).Registers.fpu = REGS[0];
        (pMyDisasm->Operand1).OpSize = 0x50;
        (pMyDisasm->Operand1).AccessMode = 1;
        strcpy((pMyDisasm->Operand2).OpMnemonic,local_20[(uVar3 & 0xf) % 8]);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).Registers.type = 0x1000;
        (pMyDisasm->Operand2).Registers.fpu = REGS[(uVar3 & 0xf) % 8];
        (pMyDisasm->Operand2).OpSize = 0x50;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ DB_(PDISASM pMyDisasm)
{
    long MyMODRM;
    char (*pRegistersFPU)[8][8] ;

    GV.DECALAGE_EIP = 0;
    if (!Security(2, pMyDisasm)) {return;}
    MyMODRM = *((UInt8*) (GV.EIP_+1));
    pRegistersFPU = &RegistersFPU_Masm;
    if (GV.SYNTAX_ == NasmSyntax) {
        pRegistersFPU = &RegistersFPU_Nasm;
    }
    if (MyMODRM <= 0xbf) {

        GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
        switch (GV.REGOPCODE) {
case 0:
            GV.MemDecoration = Arg2dword;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fild");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 1:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fisttp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 2:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fist");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 3:
            GV.MemDecoration = Arg1dword;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fistp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
case 5:
            GV.MemDecoration = Arg2tbyte;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fld");
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REG0;
            pMyDisasm->Operand1.OpSize = 80;
break;
case 7:
            GV.MemDecoration = Arg1tbyte;
            decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
            pMyDisasm->Instruction.Category = FPU_INSTRUCTION+DATA_TRANSFER;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fstp");
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REG0;
            pMyDisasm->Operand2.OpSize = 80;
break;
default:
            failDecode(pMyDisasm);
        }
    }
    else {
        if ((MyMODRM & 0xf0) == 0xc0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnb");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovne");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[0];
            pMyDisasm->Operand1.OpSize = 80;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand2.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xd0) {
            if (((MyMODRM & 0xf) >=0) && ((MyMODRM & 0xf) <=7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnbe");
                #endif
            }
            else {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcmovnu");
                #endif
                pMyDisasm->Operand2.AccessMode = WRITE;
            }
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = FPU_REG;
            pMyDisasm->Operand1.Registers.fpu = REGS[0];
            pMyDisasm->Operand1.OpSize = 80;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
            #endif
            pMyDisasm->Operand2.OpType = REGISTER_TYPE;
            pMyDisasm->Operand2.Registers.type = FPU_REG;
            pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
            pMyDisasm->Operand2.OpSize = 80;
        }
        else if ((MyMODRM & 0xf0) == 0xe0) {

            if ((MyMODRM & 0xf) ==0) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fneni");
                #endif
            }
            else if ((MyMODRM & 0xf) ==1) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fndisi");
                #endif
            }
            else if ((MyMODRM & 0xf) ==2) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fnclex");
                #endif
            }
            else if ((MyMODRM & 0xf) ==3) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+FPUCONTROL;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fninit");
                #endif
            }
            else if ((MyMODRM & 0xf) ==4) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+UNSUPPORTED_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fnsetpm");
                #endif
            }
            else if ((MyMODRM & 0xf) ==5) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+ARITHMETIC_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "frstpm");
                #endif
            }
            else if (((MyMODRM & 0xf) >=0x8) && ((MyMODRM & 0xf) <=0xf)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fucomi");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[0];
                pMyDisasm->Operand1.OpSize = 80;
                pMyDisasm->Operand1.AccessMode = READ;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand2.OpSize = 80;
            }
            else {
                failDecode(pMyDisasm);
            }
        }
        else if ((MyMODRM & 0xf0) == 0xf0) {
            if (((MyMODRM & 0xf) >=0x0) && ((MyMODRM & 0xf) <=0x7)) {
                pMyDisasm->Instruction.Category = FPU_INSTRUCTION+COMPARISON_INSTRUCTION;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fcomi");
                #endif
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand1.OpMnemonic, (*pRegistersFPU)[0]);
                #endif
                pMyDisasm->Operand1.OpType = REGISTER_TYPE;
                pMyDisasm->Operand1.Registers.type = FPU_REG;
                pMyDisasm->Operand1.Registers.fpu = REGS[0];
                pMyDisasm->Operand1.OpSize = 80;
                pMyDisasm->Operand1.AccessMode = READ;
                #ifndef BEA_LIGHT_DISASSEMBLY
                   (void) strcpy (pMyDisasm->Operand2.OpMnemonic, (*pRegistersFPU)[(MyMODRM & 0xf)%8]);
                #endif
                pMyDisasm->Operand2.OpType = REGISTER_TYPE;
                pMyDisasm->Operand2.Registers.type = FPU_REG;
                pMyDisasm->Operand2.Registers.fpu = REGS[(MyMODRM & 0xf)%8];
                pMyDisasm->Operand2.OpSize = 80;
            }
            else {
                failDecode(pMyDisasm);
            }
        }
        else {
                failDecode(pMyDisasm);
        }
    }
    GV.EIP_ += GV.DECALAGE_EIP+2;
}